

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldTest_Cleanups_Test::
RepeatedPtrFieldTest_Cleanups_Test(RepeatedPtrFieldTest_Cleanups_Test *this)

{
  RepeatedPtrFieldTest_Cleanups_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__RepeatedPtrFieldTest_Cleanups_Test_029eae00;
  return;
}

Assistant:

TEST(RepeatedPtrFieldTest, Cleanups) {
  Arena arena;
  auto growth = internal::CleanupGrowth(
      arena, [&] { Arena::Create<RepeatedPtrField<std::string>>(&arena); });
  EXPECT_THAT(growth.cleanups, testing::IsEmpty());

  growth = internal::CleanupGrowth(
      arena, [&] { Arena::Create<RepeatedPtrField<TestAllTypes>>(&arena); });
  EXPECT_THAT(growth.cleanups, testing::IsEmpty());
}